

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_fwd.hpp
# Opt level: O2

void __thiscall toml::detail::maybe::maybe(maybe *this,maybe *param_1)

{
  (this->super_scanner_base)._vptr_scanner_base = (_func_int **)&PTR__maybe_00499c10;
  scanner_storage::scanner_storage(&this->other_,&param_1->other_);
  return;
}

Assistant:

maybe(const maybe&)            = default;